

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::fms(Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  double dVar1;
  double __y;
  double __z;
  BasicType BVar2;
  float fVar3;
  float __y_00;
  float __z_00;
  uintptr_t uStack_50;
  
  BVar2 = wasm::Type::getBasic(&this->type);
  if (BVar2 == f64) {
    dVar1 = getf64(left);
    __y = getf64(right);
    __z = getf64(this);
    dVar1 = ::fma(-dVar1,__y,__z);
    (__return_storage_ptr__->field_0).i64 = (int64_t)dVar1;
    uStack_50 = 5;
  }
  else {
    if (BVar2 != f32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x641);
    }
    fVar3 = getf32(left);
    __y_00 = getf32(right);
    __z_00 = getf32(this);
    fVar3 = fmaf(-fVar3,__y_00,__z_00);
    (__return_storage_ptr__->field_0).i32 = (int32_t)fVar3;
    uStack_50 = 4;
  }
  (__return_storage_ptr__->type).id = uStack_50;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::fms(const Literal& left, const Literal& right) const {
  switch (type.getBasic()) {
    case Type::f32:
      return Literal(::fmaf(-left.getf32(), right.getf32(), getf32()));
      break;
    case Type::f64:
      return Literal(::fma(-left.getf64(), right.getf64(), getf64()));
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}